

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O2

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Nop::test_method(IsWitnessProgram_Invalid_Nop *this)

{
  long lVar1;
  CScript *pCVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar3;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char **local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program;
  CScript nowit;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&program,10,(allocator_type *)&nowit);
  nowit.super_CScriptBase._union._16_8_ = 0;
  nowit.super_CScriptBase._24_8_ = 0;
  nowit.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  nowit.super_CScriptBase._union._8_8_ = 0;
  pCVar2 = CScript::operator<<(&nowit,OP_0);
  pCVar2 = CScript::operator<<(pCVar2,OP_NOP);
  CScript::operator<<(pCVar2,&program);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8b;
  file.m_begin = (iterator)&local_60;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)anon_unknown_20::IsNoWitnessProgram(&nowit);
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90 = &local_b8;
  local_b8 = "IsNoWitnessProgram(nowit)";
  local_b0 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_c0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,&local_a8,1,0,WARN,_cVar3,(size_t)&local_c8,0x8b);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&nowit.super_CScriptBase);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Nop)
{
    std::vector<unsigned char> program(10);
    CScript nowit;
    nowit << OP_0 << OP_NOP << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));
}